

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

void __thiscall Liby::TimerQueue::~TimerQueue(TimerQueue *this)

{
  TimerQueue *this_local;
  
  std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->timerChan_);
  BinaryHeap<Liby::WeakTimerHolder>::~BinaryHeap(&this->queue_);
  std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::~unique_ptr
            (&this->timerChan_);
  std::shared_ptr<Liby::FileDescriptor>::~shared_ptr(&this->timerfp_);
  return;
}

Assistant:

TimerQueue::~TimerQueue() {
#ifdef __linux__
    //　使timerChan_析构时不去调用Poller虚基类的虚函数
    if (timerChan_) {
        //        timerChan_->setPoller(nullptr);
    }
#endif
}